

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O3

uint32_t helper_bcdcfn_ppc64(ppc_avr_t *r,ppc_avr_t *b,uint32_t ps)

{
  uint16_t uVar1;
  bool bVar2;
  byte bVar3;
  uint32_t uVar4;
  ulong uVar5;
  byte bVar6;
  ulong uVar7;
  ulong uStack_18;
  ppc_avr_t ret;
  
  uVar1 = b->u16[0];
  uStack_18 = 0;
  ret.u64[0] = 0;
  uVar5 = 1;
  do {
    bVar2 = true;
    if ((ushort)(b->u16[uVar5] - 0x3a) < 0xfff6) break;
    bVar6 = (byte)b->u16[uVar5] & 0xf;
    uVar7 = uVar5 >> 1 & 0x7fffffff;
    bVar3 = *(byte *)((long)&uStack_18 + uVar7);
    if ((uVar5 & 1) == 0) {
      bVar6 = bVar3 & 0xf0 | bVar6;
    }
    else {
      bVar6 = bVar6 << 4 | bVar3 & 0xf;
    }
    *(byte *)((long)&uStack_18 + uVar7) = bVar6;
    uVar5 = uVar5 + 1;
    bVar2 = (uVar1 - 0x2b & 0xfffd) != 0;
  } while (uVar5 != 8);
  bVar3 = 0xd;
  if (uVar1 == 0x2b) {
    bVar3 = (ps != 0) * '\x03' | 0xc;
  }
  bVar3 = (byte)uStack_18 & 0xf0 | bVar3;
  uStack_18 = CONCAT71(uStack_18._1_7_,bVar3);
  uVar5 = (ulong)bVar3;
  if ((ret.u64[0] == 0) && (uVar5 = uStack_18, uStack_18 < 0x10)) {
    uVar4 = 2;
  }
  else {
    bVar3 = ((byte)uVar5 & 0xf) - 10;
    if (bVar3 < 6) {
      uVar4 = *(uint32_t *)(&DAT_00db47d8 + (ulong)bVar3 * 4);
    }
    else {
      uVar4 = 8;
    }
  }
  if (bVar2) {
    uVar4 = 1;
  }
  r->u64[0] = uStack_18;
  r->u64[1] = ret.u64[0];
  return uVar4;
}

Assistant:

static uint16_t get_national_digit(ppc_avr_t *reg, int n)
{
    return reg->VsrH(7 - n);
}